

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_is_valid_asn1_integer(CBS *cbs,int *out_is_negative)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  byte *pbVar4;
  uint uVar5;
  
  sVar3 = cbs->len;
  uVar5 = 0;
  if (sVar3 != 0) {
    pbVar4 = cbs->data;
    bVar1 = *pbVar4;
    if (out_is_negative != (int *)0x0) {
      *out_is_negative = (uint)(bVar1 >> 7);
    }
    uVar5 = 1;
    if (sVar3 != 1) {
      bVar2 = pbVar4[1];
      uVar5 = 0;
      if (bVar1 != 0 || (char)bVar2 < '\0') {
        uVar5 = (uint)(bVar1 != 0xff || -1 < (char)bVar2);
      }
    }
  }
  return uVar5;
}

Assistant:

int CBS_is_valid_asn1_integer(const CBS *cbs, int *out_is_negative) {
  CBS copy = *cbs;
  uint8_t first_byte, second_byte;
  if (!CBS_get_u8(&copy, &first_byte)) {
    return 0;  // INTEGERs may not be empty.
  }
  if (out_is_negative != NULL) {
    *out_is_negative = (first_byte & 0x80) != 0;
  }
  if (!CBS_get_u8(&copy, &second_byte)) {
    return 1;  // One byte INTEGERs are always minimal.
  }
  if ((first_byte == 0x00 && (second_byte & 0x80) == 0) ||
      (first_byte == 0xff && (second_byte & 0x80) != 0)) {
    return 0;  // The value is minimal iff the first 9 bits are not all equal.
  }
  return 1;
}